

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyBinary
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  Plausibility PVar1;
  uint segmentCount;
  ulong uVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  ArrayPtr<const_unsigned_char> prefix_00;
  Fault f;
  DebugComparison<unsigned_int,_int> _kjCondition;
  Fault local_30;
  DebugComparison<unsigned_int,_int> local_28;
  
  uVar2 = prefix.size_;
  pbVar3 = prefix.ptr;
  PVar1 = PLAUSIBLE;
  if (7 < uVar2) {
    segmentCount = ((uint)*(ushort *)(pbVar3 + 2) << 0x10 | (uint)pbVar3[1] << 8) + (uint)*pbVar3 +
                   1;
    PVar1 = IMPOSSIBLE;
    if (((segmentCount < 0x10001) && (PVar1 = IMPLAUSIBLE, segmentCount < 0x101)) &&
       (*(uint *)(pbVar3 + 4) < 0x8000001)) {
      iVar4 = segmentCount * 4 + (*pbVar3 & 1) * 4;
      uVar5 = iVar4 + 4;
      local_28.left = uVar5 & 4;
      local_28.result = local_28.left == 0;
      local_28.right = 0;
      local_28.op.content.ptr = " == ";
      local_28.op.content.size_ = 5;
      if (!local_28.result) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
                  (&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                   ,0x574,FAILED,"segment0Offset % 8 == 0","_kjCondition,",&local_28);
        kj::_::Debug::Fault::fatal(&local_30);
      }
      PVar1 = PLAUSIBLE;
      if (iVar4 + 0xc <= uVar2) {
        prefix_00.ptr = pbVar3 + uVar5;
        prefix_00.size_ = uVar2 - uVar5;
        PVar1 = isPlausiblyFlat(this,prefix_00,segmentCount);
        return PVar1;
      }
    }
  }
  return PVar1;
}

Assistant:

Plausibility isPlausiblyBinary(kj::ArrayPtr<const byte> prefix) {
    if (prefix.size() < 8) {
      // Not enough prefix to say.
      return PLAUSIBLE;
    }

    uint32_t segmentCount = prefix[0] | (prefix[1] << 8)
                          | (prefix[2] << 16) | (prefix[3] << 24);

    // Actually, the bytes store segmentCount - 1.
    ++segmentCount;

    if (segmentCount > 65536) {
      // While technically possible, this is so implausible that we should mark it impossible.
      // This helps to make sure we fail fast on packed input.
      return IMPOSSIBLE;
    } else if (segmentCount > 256) {
      // Implausible segment count.
      return IMPLAUSIBLE;
    }

    uint32_t segment0Size = prefix[4] | (prefix[5] << 8)
                          | (prefix[6] << 16) | (prefix[7] << 24);

    if (segment0Size > (1 << 27)) {
      // Segment larger than 1G seems implausible.
      return IMPLAUSIBLE;
    }

    uint32_t segment0Offset = 4 + segmentCount * 4;
    if (segment0Offset % 8 != 0) {
      segment0Offset += 4;
    }
    KJ_ASSERT(segment0Offset % 8 == 0);

    if (prefix.size() < segment0Offset + 8) {
      // Segment 0 is past our prefix, so we can't check it.
      return PLAUSIBLE;
    }

    return isPlausiblyFlat(prefix.slice(segment0Offset, prefix.size()), segmentCount);
  }